

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  cpp_dec_float<200U,_int,_void> *pcVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  byte bVar22;
  uint local_5f4;
  int *local_5b8;
  cpp_dec_float<200U,_int,_void> local_5a8;
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  cpp_dec_float<200U,_int,_void> local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar22 = 0;
  puVar16 = (uint *)eps;
  puVar19 = local_b0;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar19 = puVar19 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  puVar16 = (uint *)eps2;
  puVar19 = local_130;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar19 = puVar19 + 1;
  }
  local_c0 = (eps2->m_backend).exp;
  local_bc = (eps2->m_backend).neg;
  local_b8._0_4_ = (eps2->m_backend).fpclass;
  local_b8._4_4_ = (eps2->m_backend).prec_elem;
  vSolveLright2(this,rhs,ridx,rn,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_b0,rhs2,ridx2,rn2,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_130);
  local_4c8 = (undefined1  [16])0x0;
  local_4d8 = (undefined1  [16])0x0;
  local_4e8 = (undefined1  [16])0x0;
  local_4f8 = (undefined1  [16])0x0;
  local_508 = (undefined1  [16])0x0;
  local_518 = (undefined1  [16])0x0;
  local_528 = (undefined1  [16])0x0;
  piVar5 = (this->row).perm;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (*rn < 1) {
      iVar8 = 0;
    }
    else {
      lVar11 = 0;
      uVar14 = 0;
      do {
        uVar13 = (uint)uVar14;
        iVar8 = ridx[lVar11];
        pcVar1 = &rhs[iVar8].m_backend;
        pcVar17 = pcVar1;
        puVar16 = (uint *)local_528;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar16 = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
        }
        iVar7 = rhs[iVar8].m_backend.exp;
        bVar2 = rhs[iVar8].m_backend.neg;
        pcVar17 = pcVar1;
        pcVar20 = &local_5a8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_5a8.fpclass = rhs[iVar8].m_backend.fpclass;
        local_5a8.prec_elem = rhs[iVar8].m_backend.prec_elem;
        pnVar18 = eps;
        pcVar17 = &local_430;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar17->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_430.exp = (eps->m_backend).exp;
        local_430.neg = (eps->m_backend).neg;
        local_430.fpclass = (eps->m_backend).fpclass;
        local_430.prec_elem = (eps->m_backend).prec_elem;
        local_5a8.neg = bVar2;
        if ((bVar2 == true) &&
           (local_5a8.data._M_elems[0] != 0 || local_5a8.fpclass != cpp_dec_float_finite)) {
          local_5a8.neg = false;
        }
        local_5a8.exp = iVar7;
        if ((local_430.fpclass == cpp_dec_float_NaN || local_5a8.fpclass == cpp_dec_float_NaN) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_5a8,&local_430), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
        }
        else {
          iVar8 = piVar5[iVar8];
          uVar9 = uVar13;
          if (0 < (int)uVar13) {
            do {
              uVar15 = (uint)uVar14 - 1;
              uVar10 = uVar15 >> 1;
              uVar9 = (uint)uVar14;
              if (iVar8 <= ridx[uVar10]) break;
              ridx[uVar14] = ridx[uVar10];
              uVar14 = (ulong)uVar10;
              uVar9 = uVar10;
            } while (1 < uVar15);
          }
          uVar14 = (ulong)(uVar13 + 1);
          ridx[(int)uVar9] = iVar8;
        }
        iVar8 = (int)uVar14;
        lVar11 = lVar11 + 1;
      } while (lVar11 < *rn);
    }
    *rn = iVar8;
  }
  else {
    if (*rn < 1) {
      local_5f4 = 0;
    }
    else {
      local_5b8 = forestIdx;
      lVar11 = 0;
      local_5f4 = 0;
      do {
        iVar8 = ridx[lVar11];
        pcVar1 = &rhs[iVar8].m_backend;
        pcVar17 = pcVar1;
        puVar16 = (uint *)local_528;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar16 = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
        }
        iVar7 = rhs[iVar8].m_backend.exp;
        bVar2 = rhs[iVar8].m_backend.neg;
        fVar3 = rhs[iVar8].m_backend.fpclass;
        iVar4 = rhs[iVar8].m_backend.prec_elem;
        pcVar17 = pcVar1;
        pcVar20 = &local_5a8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        pnVar18 = eps;
        pcVar17 = &local_3b0;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar17->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_3b0.exp = (eps->m_backend).exp;
        local_3b0.neg = (eps->m_backend).neg;
        local_3b0.fpclass = (eps->m_backend).fpclass;
        local_3b0.prec_elem = (eps->m_backend).prec_elem;
        local_5a8.prec_elem = iVar4;
        local_5a8.fpclass = fVar3;
        local_5a8.neg = bVar2;
        if ((bVar2 == true) && (local_5a8.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          local_5a8.neg = false;
        }
        local_5a8.exp = iVar7;
        if ((local_3b0.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_5a8,&local_3b0), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
        }
        else {
          *local_5b8 = iVar8;
          iVar6 = piVar5[iVar8];
          uVar13 = local_5f4;
          if (0 < (int)local_5f4) {
            do {
              uVar9 = uVar13 - 1;
              uVar10 = uVar9 >> 1;
              if (iVar6 <= ridx[uVar10]) break;
              ridx[uVar13] = ridx[uVar10];
              uVar13 = uVar10;
            } while (1 < uVar9);
          }
          local_5b8 = local_5b8 + 1;
          local_5f4 = local_5f4 + 1;
          ridx[(int)uVar13] = iVar6;
          puVar16 = (uint *)local_528;
          pnVar18 = forest + iVar8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          forest[iVar8].m_backend.exp = iVar7;
          forest[iVar8].m_backend.neg = bVar2;
          forest[iVar8].m_backend.fpclass = fVar3;
          forest[iVar8].m_backend.prec_elem = iVar4;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *rn);
    }
    *rn = local_5f4;
    *forestNum = local_5f4;
  }
  if (*rn2 < 1) {
    iVar8 = 0;
  }
  else {
    lVar11 = 0;
    uVar14 = 0;
    do {
      uVar13 = (uint)uVar14;
      iVar8 = ridx2[lVar11];
      pcVar1 = &rhs2[iVar8].m_backend;
      pcVar17 = pcVar1;
      puVar16 = (uint *)local_528;
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar16 = (pcVar17->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
      }
      iVar7 = rhs2[iVar8].m_backend.exp;
      bVar2 = rhs2[iVar8].m_backend.neg;
      pcVar17 = pcVar1;
      pcVar20 = &local_5a8;
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_5a8.fpclass = rhs2[iVar8].m_backend.fpclass;
      local_5a8.prec_elem = rhs2[iVar8].m_backend.prec_elem;
      pnVar18 = eps2;
      pcVar17 = &local_4b0;
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar17->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_4b0.exp = (eps2->m_backend).exp;
      local_4b0.neg = (eps2->m_backend).neg;
      local_4b0.fpclass = (eps2->m_backend).fpclass;
      local_4b0.prec_elem = (eps2->m_backend).prec_elem;
      local_5a8.neg = bVar2;
      if ((bVar2 == true) &&
         (local_5a8.data._M_elems[0] != 0 || local_5a8.fpclass != cpp_dec_float_finite)) {
        local_5a8.neg = false;
      }
      local_5a8.exp = iVar7;
      if ((local_4b0.fpclass == cpp_dec_float_NaN || local_5a8.fpclass == cpp_dec_float_NaN) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_5a8,&local_4b0), iVar7 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
      }
      else {
        iVar8 = piVar5[iVar8];
        uVar9 = uVar13;
        if (0 < (int)uVar13) {
          do {
            uVar15 = (uint)uVar14 - 1;
            uVar10 = uVar15 >> 1;
            uVar9 = (uint)uVar14;
            if (iVar8 <= ridx2[uVar10]) break;
            ridx2[uVar14] = ridx2[uVar10];
            uVar14 = (ulong)uVar10;
            uVar9 = uVar10;
          } while (1 < uVar15);
        }
        uVar14 = (ulong)(uVar13 + 1);
        ridx2[(int)uVar9] = iVar8;
      }
      iVar8 = (int)uVar14;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *rn2);
  }
  *rn2 = iVar8;
  iVar8 = *rn;
  pnVar18 = eps;
  pnVar21 = &local_1b0;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = (eps->m_backend).exp;
  local_1b0.m_backend.neg = (eps->m_backend).neg;
  local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
  local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar8 = vSolveUright(this,vec,idx,rhs,ridx,iVar8,&local_1b0);
  *rn = iVar8;
  iVar8 = *rn2;
  pnVar18 = eps2;
  pnVar21 = &local_230;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = (eps2->m_backend).exp;
  local_230.m_backend.neg = (eps2->m_backend).neg;
  local_230.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_230.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  iVar8 = vSolveUright(this,vec2,idx2,rhs2,ridx2,iVar8,&local_230);
  *rn2 = iVar8;
  if ((this->l).updateType == 0) {
    iVar8 = *rn;
    pnVar18 = eps;
    pnVar21 = &local_2b0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (eps->m_backend).exp;
    local_2b0.m_backend.neg = (eps->m_backend).neg;
    local_2b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_2b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar8 = vSolveUpdateRight(this,vec,idx,iVar8,&local_2b0);
    *rn = iVar8;
    iVar8 = *rn2;
    pnVar18 = eps2;
    pnVar21 = &local_330;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = (eps2->m_backend).exp;
    local_330.m_backend.neg = (eps2->m_backend).neg;
    local_330.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_330.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    iVar8 = vSolveUpdateRight(this,vec2,idx2,iVar8,&local_330);
    *rn2 = iVar8;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}